

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStringVectorAttribute.cpp
# Opt level: O0

void __thiscall
Imf_3_4::
TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::readValueFrom(TypedAttribute<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *this,IStream *is,int size,int version)

{
  int iVar1;
  InputExc *this_00;
  int in_EDX;
  int *in_RSI;
  string str;
  int strSize;
  int read;
  int *in_stack_ffffffffffffff88;
  IStream *in_stack_ffffffffffffff90;
  value_type *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffffa0;
  value_type local_50;
  int local_20;
  int local_1c;
  int local_14;
  int *local_10;
  
  local_1c = 0;
  local_14 = in_EDX;
  local_10 = in_RSI;
  while( true ) {
    if (local_14 <= local_1c) {
      return;
    }
    Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    iVar1 = Xdr::size<int>();
    local_1c = iVar1 + local_1c;
    if ((local_20 < 0) || (local_14 - local_1c < local_20)) break;
    __x = &local_50;
    std::__cxx11::string::string((string *)__x);
    std::__cxx11::string::resize((ulong)__x);
    if (0 < local_20) {
      in_stack_ffffffffffffff88 = local_10;
      in_stack_ffffffffffffff90 = (IStream *)std::__cxx11::string::operator[]((ulong)&local_50);
      Xdr::read<Imf_3_4::StreamIO,Imf_3_4::IStream>
                (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,0);
    }
    local_1c = local_1c + local_20;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(in_stack_ffffffffffffffa0,__x);
    std::__cxx11::string::~string((string *)&local_50);
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(this_00,"Invalid size field reading stringvector attribute");
  __cxa_throw(this_00,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

IMF_EXPORT void
StringVectorAttribute::readValueFrom (
    OPENEXR_IMF_INTERNAL_NAMESPACE::IStream& is, int size, int version)
{
    int read = 0;

    while (read < size)
    {
        int strSize;
        Xdr::read<StreamIO> (is, strSize);
        read += Xdr::size<int> ();

        // check there is enough space remaining in attribute to
        // contain claimed string length
        if (strSize < 0 || strSize > size - read)
        {
            throw IEX_NAMESPACE::InputExc (
                "Invalid size field reading stringvector attribute");
        }

        std::string str;
        str.resize (strSize);

        if (strSize > 0) { Xdr::read<StreamIO> (is, &str[0], strSize); }

        read += strSize;

        _value.push_back (str);
    }
}